

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O3

void concept_const_suite::random_access_iterator_difference(void)

{
  long lVar1;
  ulong uVar2;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> data;
  undefined4 local_54;
  vector<int,_std::allocator<int>_> local_50;
  ulong local_38 [2];
  
  local_38[0] = 0x160000000b;
  local_38[1] = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,__l,(allocator_type *)&local_54);
  lVar1 = (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar2 = lVar1 >> 1;
  local_38[0] = -(ulong)(lVar1 != 2);
  if ((uVar2 & uVar2 - 1) == 0) {
    local_38[0] = (uVar2 | 0xfffffffffffffffe) + 1;
  }
  local_54 = 0xffffffff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("alpha.begin() - bravo.begin()","-1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x201,"void concept_const_suite::random_access_iterator_difference()",local_38,
             (allocator_type *)&local_54);
  local_38[0] = (ulong)(~(uint)uVar2 & 1);
  if ((uVar2 & uVar2 - 1) != 0) {
    local_38[0] = (ulong)(lVar1 != 2);
  }
  local_54 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("bravo.begin() - alpha.begin()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x202,"void concept_const_suite::random_access_iterator_difference()",local_38,
             (allocator_type *)&local_54);
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void random_access_iterator_difference()
{
    // b - a
    std::vector<int> data = { 11, 22, 33, 44 };
    const circular_view<int> alpha(data.begin(), data.end(), data.begin(), data.size());
    const circular_view<int> bravo(data.begin(), data.end(), std::next(data.begin()), data.size() - 1);
    BOOST_TEST_EQ(alpha.begin() - bravo.begin(), -1);
    BOOST_TEST_EQ(bravo.begin() - alpha.begin(), 1);
}